

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_global(REF_CELL ref_cell,REF_NODE ref_node,REF_LONG **global)

{
  long lVar1;
  uint uVar2;
  void *pvVar3;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG offset;
  REF_INT proc;
  REF_INT *counts;
  int local_38;
  REF_INT part;
  REF_INT cell;
  REF_INT ncell;
  REF_MPI ref_mpi;
  REF_LONG **global_local;
  REF_NODE ref_node_local;
  REF_CELL ref_cell_local;
  
  _cell = ref_node->ref_mpi;
  ref_mpi = (REF_MPI)global;
  global_local = (REF_LONG **)ref_node;
  ref_node_local = (REF_NODE)ref_cell;
  if (ref_cell->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x5c6,
           "ref_cell_global","malloc *global of REF_LONG negative");
    ref_cell_local._4_4_ = 1;
  }
  else {
    pvVar3 = malloc((long)ref_cell->max << 3);
    *(void **)ref_mpi = pvVar3;
    lVar1._0_4_ = ref_mpi->n;
    lVar1._4_4_ = ref_mpi->id;
    if (lVar1 == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x5c6,
             "ref_cell_global","malloc *global of REF_LONG NULL");
      ref_cell_local._4_4_ = 2;
    }
    else {
      part = 0;
      for (local_38 = 0; local_38 < *(int *)((long)&ref_node_local->part + 4);
          local_38 = local_38 + 1) {
        if (((-1 < local_38) && (local_38 < *(int *)((long)&ref_node_local->part + 4))) &&
           (*(int *)((long)ref_node_local->real + (long)(ref_node_local->blank * local_38) * 4) !=
            -1)) {
          uVar2 = ref_cell_part((REF_CELL)ref_node_local,(REF_NODE)global_local,local_38,
                                (REF_INT *)((long)&counts + 4));
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x5ca,"ref_cell_global",(ulong)uVar2,"cell part");
            return uVar2;
          }
          if (_cell->id == counts._4_4_) {
            part = part + 1;
          }
        }
      }
      if (_cell->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x5d0,"ref_cell_global","malloc counts of REF_INT negative");
        ref_cell_local._4_4_ = 1;
      }
      else {
        pvVar3 = malloc((long)_cell->n << 2);
        if (pvVar3 == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x5d0,"ref_cell_global","malloc counts of REF_INT NULL");
          ref_cell_local._4_4_ = 2;
        }
        else {
          uVar2 = ref_mpi_allgather(_cell,&part,pvVar3,1);
          if (uVar2 == 0) {
            _ref_private_macro_code_rss_1 = 0;
            for (offset._4_4_ = 0; offset._4_4_ < _cell->id; offset._4_4_ = offset._4_4_ + 1) {
              _ref_private_macro_code_rss_1 =
                   *(int *)((long)pvVar3 + (long)offset._4_4_ * 4) + _ref_private_macro_code_rss_1;
            }
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
            for (local_38 = 0; local_38 < *(int *)((long)&ref_node_local->part + 4);
                local_38 = local_38 + 1) {
              if (((-1 < local_38) && (local_38 < *(int *)((long)&ref_node_local->part + 4))) &&
                 (*(int *)((long)ref_node_local->real + (long)(ref_node_local->blank * local_38) * 4
                          ) != -1)) {
                uVar2 = ref_cell_part((REF_CELL)ref_node_local,(REF_NODE)global_local,local_38,
                                      (REF_INT *)((long)&counts + 4));
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                         ,0x5d7,"ref_cell_global",(ulong)uVar2,"cell part");
                  return uVar2;
                }
                if (_cell->id == counts._4_4_) {
                  *(long *)(*(long *)ref_mpi + (long)local_38 * 8) = _ref_private_macro_code_rss_1;
                  _ref_private_macro_code_rss_1 = _ref_private_macro_code_rss_1 + 1;
                }
              }
            }
            ref_cell_local._4_4_ =
                 ref_cell_ghost_long((REF_CELL)ref_node_local,(REF_NODE)global_local,
                                     *(REF_LONG **)ref_mpi);
            if (ref_cell_local._4_4_ == 0) {
              ref_cell_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                     ,0x5de,"ref_cell_global",(ulong)ref_cell_local._4_4_,"ghost");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x5d1,"ref_cell_global",(ulong)uVar2,"gather size");
            ref_cell_local._4_4_ = uVar2;
          }
        }
      }
    }
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cell_global(REF_CELL ref_cell, REF_NODE ref_node,
                                   REF_LONG **global) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT ncell, cell, part, *counts, proc;
  REF_LONG offset;

  ref_malloc(*global, ref_cell_max(ref_cell), REF_LONG);

  ncell = 0;
  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "cell part");
    if (ref_mpi_rank(ref_mpi) == part) {
      ncell++;
    }
  }

  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &ncell, counts, REF_INT_TYPE), "gather size");
  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) offset += counts[proc];
  ref_free(counts);

  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "cell part");
    if (ref_mpi_rank(ref_mpi) == part) {
      (*global)[cell] = offset;
      offset++;
    }
  }

  RSS(ref_cell_ghost_long(ref_cell, ref_node, *global), "ghost");

  return REF_SUCCESS;
}